

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCompression.cpp
# Opt level: O0

void anon_unknown.dwarf_2321f3::writeRead
               (Array2D<unsigned_int> *pi1,Array2D<Imath_3_2::half> *ph1,Array2D<float> *pf1,
               char *fileName,LineOrder lorder,int width,int height,int xSize,int ySize,int xOffset,
               int yOffset,Compression comp)

{
  uint uVar1;
  Compression CVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  Compression *pCVar7;
  undefined4 *puVar8;
  char *pcVar9;
  uint *puVar10;
  half *phVar11;
  float *pfVar12;
  Vec2<float> *pVVar13;
  Vec2<float> *pVVar14;
  int *piVar15;
  half *phVar16;
  char *pcVar17;
  Channel *pCVar18;
  char *in_RCX;
  Array2D<float> *in_RDX;
  Array2D<Imath_3_2::half> *in_RSI;
  Array2D<unsigned_int> *in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  float fVar19;
  float fVar20;
  int in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  Compression in_stack_00000030;
  int x2;
  int x_2;
  int y2;
  int y_2;
  int oY;
  int oX;
  Box2i win;
  int tileX;
  int tileY;
  ConstIterator ii_1;
  ConstIterator hi_1;
  FrameBuffer fb_2;
  Array2D<float> pf2_1;
  Array2D<Imath_3_2::half> ph2_1;
  Array2D<unsigned_int> pi2_1;
  TiledInputFile in_1;
  int x_1;
  int y_1;
  int x1;
  int y1;
  Array2D<Imath_3_2::half> ph4;
  Array2D<Imath_3_2::half> ph3;
  int ny;
  int nx;
  int x;
  int y;
  ConstIterator ii;
  ConstIterator hi;
  FrameBuffer fb_1;
  Array2D<float> pf2;
  Array2D<Imath_3_2::half> ph2;
  Array2D<unsigned_int> pi2;
  int dwy;
  int dwx;
  int h;
  int w;
  Box2i *dw;
  TiledInputFile in;
  TiledOutputFile out;
  FrameBuffer fb;
  Header hdr;
  undefined4 in_stack_fffffffffffff5bc;
  undefined4 in_stack_fffffffffffff5c0;
  undefined4 uVar21;
  undefined4 in_stack_fffffffffffff5c4;
  undefined4 in_stack_fffffffffffff5c8;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 in_stack_fffffffffffff5cc;
  undefined4 in_stack_fffffffffffff5d0;
  undefined4 in_stack_fffffffffffff5d4;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffff620;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffff628;
  int in_stack_fffffffffffff630;
  int in_stack_fffffffffffff634;
  int local_570;
  int local_56c;
  int local_568;
  int local_564;
  int local_558;
  int local_554;
  int local_550;
  int local_54c;
  int local_548;
  int local_544;
  undefined8 local_540;
  undefined8 local_538;
  undefined8 local_528;
  undefined8 local_520;
  Slice local_510 [56];
  Slice local_4d8 [56];
  Slice local_4a0 [56];
  char local_468 [48];
  Array2D<float> local_438;
  Array2D<Imath_3_2::half> local_420;
  Array2D<unsigned_int> local_408;
  FrameBuffer local_3f0;
  Array2D<Imath_3_2::half> local_3c0;
  Array2D<Imath_3_2::half> local_3a8;
  int local_390;
  int local_38c;
  int local_388;
  int local_384;
  int local_380;
  int local_37c;
  undefined8 local_378;
  undefined8 local_370;
  undefined8 local_360;
  undefined8 local_358;
  Slice local_348 [56];
  Slice local_310 [56];
  Slice local_2d8 [56];
  char local_2a0 [48];
  Array2D<float> local_270;
  Array2D<Imath_3_2::half> local_258;
  Array2D<unsigned_int> local_240;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  int *local_218;
  undefined1 local_210 [32];
  undefined1 local_1f0 [88];
  Slice local_198 [56];
  Slice local_160 [56];
  char local_128 [52];
  TileDescription local_f4;
  Channel local_e4 [16];
  Channel local_d4 [16];
  Channel local_c4 [28];
  Vec2<float> local_a8;
  Vec2<int> local_a0;
  Vec2<int> local_98;
  Box local_90 [16];
  Vec2<int> local_80;
  Vec2<int> local_78;
  Box local_70 [16];
  TileDescription local_60 [3];
  int local_28;
  undefined4 local_24;
  char *local_20;
  Array2D<float> *local_18;
  Array2D<Imath_3_2::half> *local_10;
  Array2D<unsigned_int> *local_8;
  
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar6 = std::operator<<((ostream *)&std::cout,"compression ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,in_stack_00000030);
  poVar6 = std::operator<<(poVar6,":");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  Imath_3_2::Vec2<int>::Vec2(&local_78,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_80,local_28 + -1,in_stack_00000008 + -1);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
  Imath_3_2::Vec2<int>::Vec2(&local_98,in_stack_00000020,in_stack_00000028);
  Imath_3_2::Vec2<int>::Vec2
            (&local_a0,in_stack_00000020 + -1 + local_28,in_stack_00000028 + -1 + in_stack_00000008)
  ;
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
  Imath_3_2::Vec2<float>::Vec2(&local_a8,0.0,0.0);
  Imf_3_4::Header::Header
            ((Header *)local_60,local_70,local_90,1.0,(Vec2 *)&local_a8,1.0,INCREASING_Y,
             ZIP_COMPRESSION);
  CVar2 = in_stack_00000030;
  pCVar7 = (Compression *)Imf_3_4::Header::compression();
  *pCVar7 = CVar2;
  puVar8 = (undefined4 *)Imf_3_4::Header::lineOrder();
  *puVar8 = local_24;
  pcVar9 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_c4,UINT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar9,(Channel *)0x231e2c);
  pcVar9 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_d4,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar9,(Channel *)0x231e2f);
  pcVar9 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_e4,FLOAT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar9,(Channel *)0x231e32);
  Imf_3_4::TileDescription::TileDescription
            (&local_f4,in_stack_00000010,in_stack_00000018,ONE_LEVEL,ROUND_DOWN);
  Imf_3_4::Header::setTileDescription(local_60);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x2084fe);
  puVar10 = Imf_3_4::Array2D<unsigned_int>::operator[](local_8,(long)-in_stack_00000028);
  Imf_3_4::Slice::Slice
            (local_160,UINT,(char *)(puVar10 + -in_stack_00000020),4,(long)local_28 << 2,1,1,0.0,
             false,false);
  Imf_3_4::FrameBuffer::insert(local_128,(Slice *)0x231e2c);
  phVar11 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](local_10,(long)-in_stack_00000028);
  Imf_3_4::Slice::Slice
            (local_198,HALF,(char *)(phVar11 + -in_stack_00000020),2,(long)local_28 * 2,1,1,0.0,
             false,false);
  Imf_3_4::FrameBuffer::insert(local_128,(Slice *)0x231e2f);
  pfVar12 = Imf_3_4::Array2D<float>::operator[](local_18,(long)-in_stack_00000028);
  uVar22 = 0;
  uVar21 = 0;
  Imf_3_4::Slice::Slice
            ((Slice *)(local_1f0 + 0x20),FLOAT,(char *)(pfVar12 + -in_stack_00000020),4,
             (long)local_28 << 2,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_128,(Slice *)0x231e32);
  poVar6 = std::operator<<((ostream *)&std::cout," writing");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  remove(local_20);
  pcVar9 = local_20;
  iVar4 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledOutputFile::TiledOutputFile
            ((TiledOutputFile *)local_1f0,pcVar9,(Header *)local_60,iVar4);
  Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)local_1f0);
  iVar4 = Imf_3_4::TiledOutputFile::numXTiles((int)local_1f0);
  iVar5 = Imf_3_4::TiledOutputFile::numYTiles((int)local_1f0);
  Imf_3_4::TiledOutputFile::writeTiles((int)local_1f0,0,iVar4 + -1,0,iVar5 + -1);
  Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)local_1f0);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x2087f1);
  poVar6 = std::operator<<((ostream *)&std::cout,", reading (whole file)");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  pcVar9 = local_20;
  iVar4 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)local_210,pcVar9,iVar4);
  Imf_3_4::TiledInputFile::header();
  local_218 = (int *)Imf_3_4::Header::dataWindow();
  local_21c = (local_218[2] - *local_218) + 1;
  local_220 = (local_218[3] - local_218[1]) + 1;
  local_224 = *local_218;
  local_228 = local_218[1];
  Imf_3_4::Array2D<unsigned_int>::Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
             CONCAT44(in_stack_fffffffffffff5cc,uVar22),CONCAT44(in_stack_fffffffffffff5c4,uVar21));
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D
            ((Array2D<Imath_3_2::half> *)
             CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
             CONCAT44(in_stack_fffffffffffff5cc,uVar22),CONCAT44(in_stack_fffffffffffff5c4,uVar21));
  Imf_3_4::Array2D<float>::Array2D
            ((Array2D<float> *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
             CONCAT44(in_stack_fffffffffffff5cc,uVar22),CONCAT44(in_stack_fffffffffffff5c4,uVar21));
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x20895c);
  puVar10 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_240,(long)-local_228);
  Imf_3_4::Slice::Slice
            (local_2d8,UINT,(char *)(puVar10 + -local_224),4,(long)local_21c << 2,1,1,0.0,false,
             false);
  Imf_3_4::FrameBuffer::insert(local_2a0,(Slice *)0x231e2c);
  phVar11 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_258,(long)-local_228);
  Imf_3_4::Slice::Slice
            (local_310,HALF,(char *)(phVar11 + -local_224),2,(long)local_21c * 2,1,1,0.0,false,false
            );
  Imf_3_4::FrameBuffer::insert(local_2a0,(Slice *)0x231e2f);
  pfVar12 = Imf_3_4::Array2D<float>::operator[](&local_270,(long)-local_228);
  uVar23 = 0;
  uVar22 = 0;
  uVar21 = 1;
  Imf_3_4::Slice::Slice
            (local_348,FLOAT,(char *)(pfVar12 + -local_224),4,(long)local_21c << 2,1,1,0.0,false,
             false);
  Imf_3_4::FrameBuffer::insert(local_2a0,(Slice *)0x231e32);
  Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)local_210);
  iVar4 = Imf_3_4::TiledInputFile::numXTiles((int)local_210);
  iVar5 = Imf_3_4::TiledInputFile::numYTiles((int)local_210);
  Imf_3_4::TiledInputFile::readTiles((int)local_210,0,iVar4 + -1,0,iVar5 + -1);
  poVar6 = std::operator<<((ostream *)&std::cout,", comparing (whole file)");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  Imf_3_4::TiledInputFile::header();
  Imf_3_4::Header::displayWindow();
  Imf_3_4::Header::displayWindow();
  bVar3 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                     (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffff5cc,uVar23));
  if (!bVar3) {
    __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                  ,0x10a,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  Imf_3_4::Header::dataWindow();
  Imf_3_4::Header::dataWindow();
  bVar3 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                     (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffff5cc,uVar23));
  if (!bVar3) {
    __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                  ,0x10b,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  pfVar12 = (float *)Imf_3_4::Header::pixelAspectRatio();
  fVar19 = *pfVar12;
  pfVar12 = (float *)Imf_3_4::Header::pixelAspectRatio();
  if ((fVar19 != *pfVar12) || (NAN(fVar19) || NAN(*pfVar12))) {
    __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                  ,0x10c,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  pVVar13 = (Vec2<float> *)Imf_3_4::Header::screenWindowCenter();
  pVVar14 = (Vec2<float> *)Imf_3_4::Header::screenWindowCenter();
  bVar3 = Imath_3_2::Vec2<float>::operator==(pVVar13,pVVar14);
  if (!bVar3) {
    __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                  ,0x10e,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  pfVar12 = (float *)Imf_3_4::Header::screenWindowWidth();
  fVar19 = *pfVar12;
  pfVar12 = (float *)Imf_3_4::Header::screenWindowWidth();
  if ((fVar19 != *pfVar12) || (NAN(fVar19) || NAN(*pfVar12))) {
    __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                  ,0x10f,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  piVar15 = (int *)Imf_3_4::Header::lineOrder();
  iVar4 = *piVar15;
  piVar15 = (int *)Imf_3_4::Header::lineOrder();
  if (iVar4 != *piVar15) {
    __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                  ,0x110,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  piVar15 = (int *)Imf_3_4::Header::compression();
  iVar4 = *piVar15;
  piVar15 = (int *)Imf_3_4::Header::compression();
  if (iVar4 != *piVar15) {
    __assert_fail("in.header ().compression () == hdr.compression ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                  ,0x111,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                 );
  }
  Imf_3_4::Header::channels();
  local_358 = Imf_3_4::ChannelList::begin();
  Imf_3_4::ChannelList::ConstIterator::ConstIterator
            ((ConstIterator *)CONCAT44(in_stack_fffffffffffff5c4,uVar22),
             (Iterator *)CONCAT44(in_stack_fffffffffffff5bc,uVar21));
  Imf_3_4::TiledInputFile::header();
  Imf_3_4::Header::channels();
  local_360 = Imf_3_4::ChannelList::begin();
  while( true ) {
    Imf_3_4::Header::channels();
    local_370 = Imf_3_4::ChannelList::end();
    Imf_3_4::ChannelList::ConstIterator::ConstIterator
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffff5c4,uVar22),
               (Iterator *)CONCAT44(in_stack_fffffffffffff5bc,uVar21));
    bVar3 = Imf_3_4::operator!=((ConstIterator *)CONCAT44(in_stack_fffffffffffff5c4,uVar22),
                                (ConstIterator *)CONCAT44(in_stack_fffffffffffff5bc,uVar21));
    if (!bVar3) break;
    pcVar9 = Imf_3_4::ChannelList::ConstIterator::name((ConstIterator *)0x20916e);
    pcVar17 = Imf_3_4::ChannelList::ConstIterator::name((ConstIterator *)0x209185);
    iVar4 = strcmp(pcVar9,pcVar17);
    if (iVar4 != 0) {
      __assert_fail("!strcmp (hi.name (), ii.name ())",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x118,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    pCVar18 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x2091e0);
    iVar4 = *(int *)pCVar18;
    pCVar18 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x209208);
    if (iVar4 != *(int *)pCVar18) {
      __assert_fail("hi.channel ().type == ii.channel ().type",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x119,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    pCVar18 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x209253);
    iVar4 = *(int *)(pCVar18 + 4);
    pCVar18 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x20927c);
    if (iVar4 != *(int *)(pCVar18 + 4)) {
      __assert_fail("hi.channel ().xSampling == ii.channel ().xSampling",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x11a,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    pCVar18 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x2092c8);
    iVar4 = *(int *)(pCVar18 + 8);
    pCVar18 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x2092f1);
    if (iVar4 != *(int *)(pCVar18 + 8)) {
      __assert_fail("hi.channel ().ySampling == ii.channel ().ySampling",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x11b,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffff5c4,uVar22));
    Imf_3_4::ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffff5c4,uVar22));
  }
  Imf_3_4::TiledInputFile::header();
  Imf_3_4::Header::channels();
  local_378 = Imf_3_4::ChannelList::end();
  bVar3 = Imf_3_4::operator==((ConstIterator *)CONCAT44(in_stack_fffffffffffff5c4,uVar22),
                              (ConstIterator *)CONCAT44(in_stack_fffffffffffff5bc,uVar21));
  if (!bVar3) {
    __assert_fail("ii == in.header ().channels ().end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                  ,0x121,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                 );
  }
  if ((((in_stack_00000030 == B44_COMPRESSION) || (in_stack_00000030 == B44A_COMPRESSION)) ||
      (in_stack_00000030 == DWAA_COMPRESSION)) || (in_stack_00000030 == DWAB_COMPRESSION)) {
    for (local_37c = 0; local_37c < local_220; local_37c = in_stack_00000018 + local_37c) {
      for (local_380 = 0; local_380 < local_21c; local_380 = in_stack_00000010 + local_380) {
        local_388 = local_21c - local_380;
        piVar15 = std::min<int>(&local_388,(int *)&stack0x00000010);
        local_384 = *piVar15;
        local_390 = local_220 - local_37c;
        piVar15 = std::min<int>(&local_390,(int *)&stack0x00000018);
        local_38c = *piVar15;
        Imf_3_4::Array2D<Imath_3_2::half>::Array2D
                  ((Array2D<Imath_3_2::half> *)
                   CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                   CONCAT44(in_stack_fffffffffffff5cc,uVar23),
                   CONCAT44(in_stack_fffffffffffff5c4,uVar22));
        Imf_3_4::Array2D<Imath_3_2::half>::Array2D
                  ((Array2D<Imath_3_2::half> *)
                   CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                   CONCAT44(in_stack_fffffffffffff5cc,uVar23),
                   CONCAT44(in_stack_fffffffffffff5c4,uVar22));
        for (local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
            local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < local_38c;
            local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
                 local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
          for (local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
              (int)local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count < local_384;
              local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
                   (int)local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
            phVar11 = Imf_3_4::Array2D<Imath_3_2::half>::operator[]
                                (local_10,(long)(local_37c +
                                                local_3f0._map._M_t._M_impl.super__Rb_tree_header.
                                                _M_node_count._4_4_));
            iVar4 = local_380 + (int)local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count
            ;
            phVar16 = Imf_3_4::Array2D<Imath_3_2::half>::operator[]
                                (&local_3a8,
                                 (long)local_3f0._map._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count._4_4_);
            phVar16[(int)local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count]._h =
                 phVar11[iVar4]._h;
            phVar11 = Imf_3_4::Array2D<Imath_3_2::half>::operator[]
                                (&local_258,
                                 (long)(local_37c +
                                       local_3f0._map._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count._4_4_));
            iVar4 = local_380 + (int)local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count
            ;
            phVar16 = Imf_3_4::Array2D<Imath_3_2::half>::operator[]
                                (&local_3c0,
                                 (long)local_3f0._map._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count._4_4_);
            phVar16[(int)local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count]._h =
                 phVar11[iVar4]._h;
          }
        }
        if ((in_stack_00000030 == B44_COMPRESSION) || (in_stack_00000030 == B44A_COMPRESSION)) {
          compareB44(in_stack_fffffffffffff634,in_stack_fffffffffffff630,in_stack_fffffffffffff628,
                     in_stack_fffffffffffff620);
        }
        Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                  ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffff5c4,uVar22));
        Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                  ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffff5c4,uVar22));
      }
    }
  }
  for (local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = 0;
      local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ < local_220;
      local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
           local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ + 1) {
    for (local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 0;
        (int)local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right < local_21c;
        local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ =
             (int)local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right + 1) {
      puVar10 = Imf_3_4::Array2D<unsigned_int>::operator[]
                          (local_8,(long)local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_header
                                         ._M_right._4_4_);
      uVar1 = puVar10[(int)local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right];
      puVar10 = Imf_3_4::Array2D<unsigned_int>::operator[]
                          (&local_240,
                           (long)local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_right._4_4_);
      if (uVar1 != puVar10[(int)local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                          ]) {
        __assert_fail("pi1[y][x] == pi2[y][x]",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x14a,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (((in_stack_00000030 != B44_COMPRESSION) && (in_stack_00000030 != B44A_COMPRESSION)) &&
         ((in_stack_00000030 != DWAA_COMPRESSION && (in_stack_00000030 != DWAB_COMPRESSION)))) {
        Imf_3_4::Array2D<Imath_3_2::half>::operator[]
                  (local_10,(long)local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                  _M_right._4_4_);
        fVar19 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_fffffffffffff5c4,uVar22));
        Imf_3_4::Array2D<Imath_3_2::half>::operator[]
                  (&local_258,
                   (long)local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_)
        ;
        fVar20 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_fffffffffffff5c4,uVar22));
        if ((fVar19 != fVar20) || (NAN(fVar19) || NAN(fVar20))) {
          __assert_fail("ph1[y][x] == ph2[y][x]",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                        ,0x14f,
                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                       );
        }
      }
      pfVar12 = Imf_3_4::Array2D<float>::operator[]
                          (local_18,(long)local_3f0._map._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_right._4_4_);
      fVar19 = pfVar12[(int)local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right];
      pfVar12 = Imf_3_4::Array2D<float>::operator[]
                          (&local_270,
                           (long)local_3f0._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_right._4_4_);
      bVar3 = equivalent(fVar19,pfVar12[(int)local_3f0._map._M_t._M_impl.super__Rb_tree_header.
                                             _M_header._M_right],in_stack_00000030);
      if (!bVar3) {
        __assert_fail("equivalent (pf1[y][x], pf2[y][x], comp)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x152,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
    }
  }
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x2099fe);
  Imf_3_4::Array2D<float>::~Array2D((Array2D<float> *)CONCAT44(in_stack_fffffffffffff5c4,uVar22));
  Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
            ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffff5c4,uVar22));
  Imf_3_4::Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffff5c4,uVar22));
  Imf_3_4::TiledInputFile::~TiledInputFile
            ((TiledInputFile *)CONCAT44(in_stack_fffffffffffff5c4,uVar22));
  poVar6 = std::operator<<((ostream *)&std::cout,", reading and comparing (tile-by-tile)");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  pcVar9 = local_20;
  iVar4 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&local_3f0,pcVar9,iVar4);
  Imf_3_4::Array2D<unsigned_int>::Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
             CONCAT44(in_stack_fffffffffffff5cc,uVar23),CONCAT44(in_stack_fffffffffffff5c4,uVar22));
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D
            ((Array2D<Imath_3_2::half> *)
             CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
             CONCAT44(in_stack_fffffffffffff5cc,uVar23),CONCAT44(in_stack_fffffffffffff5c4,uVar22));
  Imf_3_4::Array2D<float>::Array2D
            ((Array2D<float> *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
             CONCAT44(in_stack_fffffffffffff5cc,uVar23),CONCAT44(in_stack_fffffffffffff5c4,uVar22));
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x209b0b);
  puVar10 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_408,0);
  Imf_3_4::Slice::Slice
            (local_4a0,UINT,(char *)puVar10,4,(long)(int)in_stack_00000010 << 2,1,1,0.0,true,true);
  Imf_3_4::FrameBuffer::insert(local_468,(Slice *)0x231e2c);
  phVar11 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_420,0);
  Imf_3_4::Slice::Slice
            (local_4d8,HALF,(char *)phVar11,2,(long)(int)in_stack_00000010 * 2,1,1,0.0,true,true);
  Imf_3_4::FrameBuffer::insert(local_468,(Slice *)0x231e2f);
  pfVar12 = Imf_3_4::Array2D<float>::operator[](&local_438,0);
  uVar23 = 1;
  uVar22 = 1;
  uVar21 = 1;
  Imf_3_4::Slice::Slice
            (local_510,FLOAT,(char *)pfVar12,4,(long)(int)in_stack_00000010 << 2,1,1,0.0,true,true);
  Imf_3_4::FrameBuffer::insert(local_468,(Slice *)0x231e32);
  Imf_3_4::TiledInputFile::setFrameBuffer(&local_3f0);
  Imf_3_4::TiledInputFile::header();
  Imf_3_4::Header::displayWindow();
  Imf_3_4::Header::displayWindow();
  bVar3 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                     (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffff5cc,uVar23));
  if (!bVar3) {
    __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                  ,0x18b,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  Imf_3_4::Header::dataWindow();
  Imf_3_4::Header::dataWindow();
  bVar3 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                     (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffff5cc,uVar23));
  if (!bVar3) {
    __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                  ,0x18c,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  pfVar12 = (float *)Imf_3_4::Header::pixelAspectRatio();
  fVar19 = *pfVar12;
  pfVar12 = (float *)Imf_3_4::Header::pixelAspectRatio();
  if ((fVar19 != *pfVar12) || (NAN(fVar19) || NAN(*pfVar12))) {
    __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                  ,0x18d,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  pVVar13 = (Vec2<float> *)Imf_3_4::Header::screenWindowCenter();
  pVVar14 = (Vec2<float> *)Imf_3_4::Header::screenWindowCenter();
  bVar3 = Imath_3_2::Vec2<float>::operator==(pVVar13,pVVar14);
  if (!bVar3) {
    __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                  ,399,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  pfVar12 = (float *)Imf_3_4::Header::screenWindowWidth();
  fVar19 = *pfVar12;
  pfVar12 = (float *)Imf_3_4::Header::screenWindowWidth();
  if ((fVar19 == *pfVar12) && (!NAN(fVar19) && !NAN(*pfVar12))) {
    Imf_3_4::TiledInputFile::header();
    piVar15 = (int *)Imf_3_4::Header::lineOrder();
    iVar4 = *piVar15;
    piVar15 = (int *)Imf_3_4::Header::lineOrder();
    if (iVar4 != *piVar15) {
      __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x191,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::TiledInputFile::header();
    piVar15 = (int *)Imf_3_4::Header::compression();
    iVar4 = *piVar15;
    piVar15 = (int *)Imf_3_4::Header::compression();
    if (iVar4 != *piVar15) {
      __assert_fail("in.header ().compression () == hdr.compression ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x192,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::Header::channels();
    local_520 = Imf_3_4::ChannelList::begin();
    Imf_3_4::ChannelList::ConstIterator::ConstIterator
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffff5c4,uVar22),
               (Iterator *)CONCAT44(in_stack_fffffffffffff5bc,uVar21));
    Imf_3_4::TiledInputFile::header();
    Imf_3_4::Header::channels();
    local_528 = Imf_3_4::ChannelList::begin();
    while( true ) {
      Imf_3_4::Header::channels();
      local_538 = Imf_3_4::ChannelList::end();
      Imf_3_4::ChannelList::ConstIterator::ConstIterator
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffff5c4,uVar22),
                 (Iterator *)CONCAT44(in_stack_fffffffffffff5bc,uVar21));
      bVar3 = Imf_3_4::operator!=((ConstIterator *)CONCAT44(in_stack_fffffffffffff5c4,uVar22),
                                  (ConstIterator *)CONCAT44(in_stack_fffffffffffff5bc,uVar21));
      if (!bVar3) {
        Imf_3_4::TiledInputFile::header();
        Imf_3_4::Header::channels();
        local_540 = Imf_3_4::ChannelList::end();
        bVar3 = Imf_3_4::operator==((ConstIterator *)CONCAT44(in_stack_fffffffffffff5c4,uVar22),
                                    (ConstIterator *)CONCAT44(in_stack_fffffffffffff5bc,uVar21));
        if (!bVar3) {
          __assert_fail("ii == in.header ().channels ().end ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                        ,0x1a2,
                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                       );
        }
        local_544 = 0;
        do {
          iVar4 = local_544;
          iVar5 = Imf_3_4::TiledInputFile::numYTiles((int)&local_3f0);
          if (iVar5 <= iVar4) {
            Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x20a8eb);
            Imf_3_4::Array2D<float>::~Array2D
                      ((Array2D<float> *)CONCAT44(in_stack_fffffffffffff5c4,uVar22));
            Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                      ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffff5c4,uVar22));
            Imf_3_4::Array2D<unsigned_int>::~Array2D
                      ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffff5c4,uVar22));
            Imf_3_4::TiledInputFile::~TiledInputFile
                      ((TiledInputFile *)CONCAT44(in_stack_fffffffffffff5c4,uVar22));
            remove(local_20);
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            Imf_3_4::Header::~Header((Header *)local_60);
            return;
          }
          for (local_548 = 0; iVar4 = local_548,
              iVar5 = Imf_3_4::TiledInputFile::numXTiles((int)&local_3f0), iVar4 < iVar5;
              local_548 = local_548 + 1) {
            Imf_3_4::TiledInputFile::readTile((int)&local_3f0,local_548,local_544);
            Imf_3_4::TiledInputFile::dataWindowForTile((int)&local_558,(int)&local_3f0,local_548);
            iVar4 = local_558 - in_stack_00000020;
            iVar5 = local_554 - in_stack_00000028;
            local_568 = local_554;
            for (local_564 = 0; local_564 < (int)in_stack_00000018 && local_568 <= local_54c;
                local_564 = local_564 + 1) {
              local_570 = local_558;
              for (local_56c = 0; local_56c < (int)in_stack_00000010 && local_570 <= local_550;
                  local_56c = local_56c + 1) {
                puVar10 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                    (local_8,(long)(iVar5 + local_564));
                uVar1 = puVar10[iVar4 + local_56c];
                puVar10 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_408,(long)local_564);
                if (uVar1 != puVar10[local_56c]) {
                  __assert_fail("pi1[oY + y][oX + x] == pi2[y][x]",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                                ,0x1b6,
                                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                               );
                }
                if ((((in_stack_00000030 != B44_COMPRESSION) &&
                     (in_stack_00000030 != B44A_COMPRESSION)) &&
                    (in_stack_00000030 != DWAA_COMPRESSION)) &&
                   (in_stack_00000030 != DWAB_COMPRESSION)) {
                  Imf_3_4::Array2D<Imath_3_2::half>::operator[](local_10,(long)(iVar5 + local_564));
                  fVar19 = Imath_3_2::half::operator_cast_to_float
                                     ((half *)CONCAT44(in_stack_fffffffffffff5c4,uVar22));
                  Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_420,(long)local_564);
                  fVar20 = Imath_3_2::half::operator_cast_to_float
                                     ((half *)CONCAT44(in_stack_fffffffffffff5c4,uVar22));
                  if ((fVar19 != fVar20) || (NAN(fVar19) || NAN(fVar20))) {
                    __assert_fail("ph1[oY + y][oX + x] == ph2[y][x]",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                                  ,0x1bd,
                                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                                 );
                  }
                }
                pfVar12 = Imf_3_4::Array2D<float>::operator[](local_18,(long)(iVar5 + local_564));
                fVar19 = pfVar12[iVar4 + local_56c];
                pfVar12 = Imf_3_4::Array2D<float>::operator[](&local_438,(long)local_564);
                bVar3 = equivalent(fVar19,pfVar12[local_56c],in_stack_00000030);
                if (!bVar3) {
                  __assert_fail("equivalent (pf1[oY + y][oX + x], pf2[y][x], comp)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                                ,0x1c1,
                                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                               );
                }
                local_570 = local_570 + 1;
              }
              local_568 = local_568 + 1;
            }
          }
          local_544 = local_544 + 1;
        } while( true );
      }
      pcVar9 = Imf_3_4::ChannelList::ConstIterator::name((ConstIterator *)0x20a24b);
      pcVar17 = Imf_3_4::ChannelList::ConstIterator::name((ConstIterator *)0x20a262);
      iVar4 = strcmp(pcVar9,pcVar17);
      if (iVar4 != 0) {
        __assert_fail("!strcmp (hi.name (), ii.name ())",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x199,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      pCVar18 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x20a2bd);
      iVar4 = *(int *)pCVar18;
      pCVar18 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x20a2e5);
      if (iVar4 != *(int *)pCVar18) break;
      pCVar18 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x20a330);
      iVar4 = *(int *)(pCVar18 + 4);
      pCVar18 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x20a359);
      if (iVar4 != *(int *)(pCVar18 + 4)) {
        __assert_fail("hi.channel ().xSampling == ii.channel ().xSampling",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x19b,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      pCVar18 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x20a3a5);
      iVar4 = *(int *)(pCVar18 + 8);
      pCVar18 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x20a3cb);
      if (iVar4 != *(int *)(pCVar18 + 8)) {
        __assert_fail("hi.channel ().ySampling == ii.channel ().ySampling",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x19c,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      Imf_3_4::ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffff5c4,uVar22));
      Imf_3_4::ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffff5c4,uVar22));
    }
    __assert_fail("hi.channel ().type == ii.channel ().type",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                  ,0x19a,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                 );
  }
  __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                ,400,
                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
               );
}

Assistant:

void
writeRead (
    const Array2D<unsigned int>& pi1,
    const Array2D<half>&         ph1,
    const Array2D<float>&        pf1,
    const char                   fileName[],
    LineOrder                    lorder,
    int                          width,
    int                          height,
    int                          xSize,
    int                          ySize,
    int                          xOffset,
    int                          yOffset,
    Compression                  comp)
{
    //
    // Write the pixel data in pi1, ph1 and ph2 to an
    // image file using the specified compression type.
    // Read the pixel data back
    // from the file and verify that the data did not
    // change.
    //

    cout << "compression " << comp << ":" << flush;

    Header hdr (
        (Box2i (
            V2i (0, 0), // display window
            V2i (width - 1, height - 1))),
        (Box2i (
            V2i (xOffset, yOffset), // data window
            V2i (xOffset + width - 1, yOffset + height - 1))));

    hdr.compression () = comp;
    hdr.lineOrder ()   = lorder;

    hdr.channels ().insert ("I", Channel (UINT));
    hdr.channels ().insert ("H", Channel (HALF));
    hdr.channels ().insert ("F", Channel (FLOAT));

    hdr.setTileDescription (TileDescription (xSize, ySize, ONE_LEVEL));

    {
        FrameBuffer fb;

        fb.insert (
            "I", // name
            Slice (
                UINT,                             // type
                (char*) &pi1[-yOffset][-xOffset], // base
                sizeof (pi1[0][0]),               // xStride
                sizeof (pi1[0][0]) * width)       // yStride
        );

        fb.insert (
            "H", // name
            Slice (
                HALF,                             // type
                (char*) &ph1[-yOffset][-xOffset], // base
                sizeof (ph1[0][0]),               // xStride
                sizeof (ph1[0][0]) * width)       // yStride
        );

        fb.insert (
            "F", // name
            Slice (
                FLOAT,                            // type
                (char*) &pf1[-yOffset][-xOffset], // base
                sizeof (pf1[0][0]),               // xStride
                sizeof (pf1[0][0]) * width)       // yStride
        );

        cout << " writing" << flush;

        remove (fileName);
        TiledOutputFile out (fileName, hdr);
        out.setFrameBuffer (fb);
        out.writeTiles (0, out.numXTiles () - 1, 0, out.numYTiles () - 1);
    }

    {
        cout << ", reading (whole file)" << flush;

        TiledInputFile in (fileName);

        const Box2i& dw  = in.header ().dataWindow ();
        int          w   = dw.max.x - dw.min.x + 1;
        int          h   = dw.max.y - dw.min.y + 1;
        int          dwx = dw.min.x;
        int          dwy = dw.min.y;

        Array2D<unsigned int> pi2 (h, w);
        Array2D<half>         ph2 (h, w);
        Array2D<float>        pf2 (h, w);

        FrameBuffer fb;

        fb.insert (
            "I", // name
            Slice (
                UINT,                     // type
                (char*) &pi2[-dwy][-dwx], // base
                sizeof (pi2[0][0]),       // xStride
                sizeof (pi2[0][0]) * w)   // yStride
        );

        fb.insert (
            "H", // name
            Slice (
                HALF,                     // type
                (char*) &ph2[-dwy][-dwx], // base
                sizeof (ph2[0][0]),       // xStride
                sizeof (ph2[0][0]) * w)   // yStride
        );

        fb.insert (
            "F", // name
            Slice (
                FLOAT,                    // type
                (char*) &pf2[-dwy][-dwx], // base
                sizeof (pf2[0][0]),       // xStride
                sizeof (pf2[0][0]) * w)   // yStride
        );

        in.setFrameBuffer (fb);
        in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () - 1);

        cout << ", comparing (whole file)" << flush;

        assert (in.header ().displayWindow () == hdr.displayWindow ());
        assert (in.header ().dataWindow () == hdr.dataWindow ());
        assert (in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ());
        assert (
            in.header ().screenWindowCenter () == hdr.screenWindowCenter ());
        assert (in.header ().screenWindowWidth () == hdr.screenWindowWidth ());
        assert (in.header ().lineOrder () == hdr.lineOrder ());
        assert (in.header ().compression () == hdr.compression ());

        ChannelList::ConstIterator hi = hdr.channels ().begin ();
        ChannelList::ConstIterator ii = in.header ().channels ().begin ();

        while (hi != hdr.channels ().end ())
        {
            assert (!strcmp (hi.name (), ii.name ()));
            assert (hi.channel ().type == ii.channel ().type);
            assert (hi.channel ().xSampling == ii.channel ().xSampling);
            assert (hi.channel ().ySampling == ii.channel ().ySampling);

            ++hi;
            ++ii;
        }

        assert (ii == in.header ().channels ().end ());

        if (comp == B44_COMPRESSION || comp == B44A_COMPRESSION ||
            comp == DWAA_COMPRESSION || comp == DWAB_COMPRESSION)
        {
            for (int y = 0; y < h; y += ySize)
            {
                for (int x = 0; x < w; x += xSize)
                {
                    int nx = min (w - x, xSize);
                    int ny = min (h - y, ySize);

                    Array2D<half> ph3 (ny, nx);
                    Array2D<half> ph4 (ny, nx);

                    for (int y1 = 0; y1 < ny; ++y1)
                    {
                        for (int x1 = 0; x1 < nx; ++x1)
                        {
                            ph3[y1][x1] = ph1[y + y1][x + x1];
                            ph4[y1][x1] = ph2[y + y1][x + x1];
                        }
                    }

                    if (comp == B44_COMPRESSION || comp == B44A_COMPRESSION)
                    {
                        compareB44 (nx, ny, ph3, ph4);
                    }
                    else if (
                        comp == DWAA_COMPRESSION || comp == DWAB_COMPRESSION)
                    {
                        //XXX compareDwa (nx, ny, ph3, ph4);
                    }
                }
            }
        }

        for (int y = 0; y < h; ++y)
        {
            for (int x = 0; x < w; ++x)
            {
                assert (pi1[y][x] == pi2[y][x]);

                if (comp != B44_COMPRESSION && comp != B44A_COMPRESSION &&
                    comp != DWAA_COMPRESSION && comp != DWAB_COMPRESSION)
                {
                    assert (ph1[y][x] == ph2[y][x]);
                }

                assert (equivalent (pf1[y][x], pf2[y][x], comp));
            }
        }
    }

    {
        cout << ", reading and comparing (tile-by-tile)" << flush;

        TiledInputFile in (fileName);

        Array2D<unsigned int> pi2 (ySize, xSize);
        Array2D<half>         ph2 (ySize, xSize);
        Array2D<float>        pf2 (ySize, xSize);

        FrameBuffer fb;

        fb.insert (
            "I", // name
            Slice (
                UINT,                       // type
                (char*) &pi2[0][0],         // base
                sizeof (pi2[0][0]),         // xStride
                sizeof (pi2[0][0]) * xSize, // yStride
                1,                          // xSampling
                1,                          // ySampling
                0.0,                        // fillValue
                true,                       // reuse tiles
                true));

        fb.insert (
            "H", // name
            Slice (
                HALF,                       // type
                (char*) &ph2[0][0],         // base
                sizeof (ph2[0][0]),         // xStride
                sizeof (ph2[0][0]) * xSize, // yStride
                1,                          // xSampling
                1,                          // ySampling
                0.0,                        // fillValue
                true,                       // reuse tiles
                true));

        fb.insert (
            "F", // name
            Slice (
                FLOAT,                      // type
                (char*) &pf2[0][0],         // base
                sizeof (pf2[0][0]),         // xStride
                sizeof (pf2[0][0]) * xSize, // yStride
                1,                          // xSampling
                1,                          // ySampling
                0.0,                        // fillValue
                true,                       // reuse tiles
                true));

        in.setFrameBuffer (fb);

        assert (in.header ().displayWindow () == hdr.displayWindow ());
        assert (in.header ().dataWindow () == hdr.dataWindow ());
        assert (in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ());
        assert (
            in.header ().screenWindowCenter () == hdr.screenWindowCenter ());
        assert (in.header ().screenWindowWidth () == hdr.screenWindowWidth ());
        assert (in.header ().lineOrder () == hdr.lineOrder ());
        assert (in.header ().compression () == hdr.compression ());

        ChannelList::ConstIterator hi = hdr.channels ().begin ();
        ChannelList::ConstIterator ii = in.header ().channels ().begin ();

        while (hi != hdr.channels ().end ())
        {
            assert (!strcmp (hi.name (), ii.name ()));
            assert (hi.channel ().type == ii.channel ().type);
            assert (hi.channel ().xSampling == ii.channel ().xSampling);
            assert (hi.channel ().ySampling == ii.channel ().ySampling);

            ++hi;
            ++ii;
        }

        assert (ii == in.header ().channels ().end ());

        for (int tileY = 0; tileY < in.numYTiles (); tileY++)
        {
            for (int tileX = 0; tileX < in.numXTiles (); ++tileX)
            {
                in.readTile (tileX, tileY);

                IMATH_NAMESPACE::Box2i win =
                    in.dataWindowForTile (tileX, tileY);
                int oX = win.min.x - xOffset;
                int oY = win.min.y - yOffset;

                for (int y = 0, y2 = win.min.y; y < ySize && y2 <= win.max.y;
                     ++y, y2++)
                {
                    for (int x = 0, x2 = win.min.x;
                         x < xSize && x2 <= win.max.x;
                         ++x, x2++)
                    {
                        assert (pi1[oY + y][oX + x] == pi2[y][x]);

                        if (comp != B44_COMPRESSION &&
                            comp != B44A_COMPRESSION &&
                            comp != DWAA_COMPRESSION &&
                            comp != DWAB_COMPRESSION)
                        {
                            assert (ph1[oY + y][oX + x] == ph2[y][x]);
                        }

                        assert (
                            equivalent (pf1[oY + y][oX + x], pf2[y][x], comp));
                    }
                }
            }
        }
    }

    remove (fileName);
    cout << endl;
}